

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

int __thiscall
QTextCursor::select(QTextCursor *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                   fd_set *__exceptfds,timeval *__timeout)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QTextCursorPrivate *pQVar4;
  long in_FS_OFFSET;
  int unaff_retaddr;
  MoveMode in_stack_00000008;
  MoveOperation in_stack_0000000c;
  QTextCursor *in_stack_00000010;
  QTextBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a481e);
  if ((!bVar2) &&
     (pQVar4 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d),
     pQVar4->priv != (QTextDocumentPrivate *)0x0)) {
    clearSelection(this);
    pQVar4 = (QTextCursorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    QTextCursorPrivate::block(pQVar4);
    switch((QTextBlock *)(ulong)(uint)__nfds) {
    case (QTextBlock *)0x0:
      movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
      movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
      break;
    case (QTextBlock *)0x1:
      movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
      movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
      break;
    case (QTextBlock *)0x2:
      iVar3 = QTextBlock::length((QTextBlock *)(ulong)(uint)__nfds);
      if (iVar3 != 1) {
        movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
        bVar2 = movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
        if (bVar2) {
          movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
          movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
        }
        movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
      }
      break;
    case (QTextBlock *)0x3:
      movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
      movePosition(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextCursor::select(SelectionType selection)
{
    if (!d || !d->priv)
        return;

    clearSelection();

    const QTextBlock block = d->block();

    switch (selection) {
        case LineUnderCursor:
            movePosition(StartOfLine);
            movePosition(EndOfLine, KeepAnchor);
            break;
        case WordUnderCursor:
            movePosition(StartOfWord);
            movePosition(EndOfWord, KeepAnchor);
            break;
        case BlockUnderCursor:
            if (block.length() == 1) // no content
                break;
            movePosition(StartOfBlock);
            // also select the paragraph separator
            if (movePosition(PreviousBlock)) {
                movePosition(EndOfBlock);
                movePosition(NextBlock, KeepAnchor);
            }
            movePosition(EndOfBlock, KeepAnchor);
            break;
        case Document:
            movePosition(Start);
            movePosition(End, KeepAnchor);
            break;
    }
}